

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

GraphId absl::lts_20250127::GetGraphId(Mutex *mu)

{
  uint uVar1;
  GraphId GVar2;
  uint uVar3;
  bool bVar4;
  
  if ((deadlock_graph_mu & 1) == 0) {
    uVar3 = deadlock_graph_mu | 1;
    LOCK();
    UNLOCK();
    uVar1 = deadlock_graph_mu & 1;
    deadlock_graph_mu = uVar3;
    if (uVar1 == 0) goto LAB_00ffc4d0;
  }
  base_internal::SpinLock::SlowLock((SpinLock *)&deadlock_graph_mu);
LAB_00ffc4d0:
  GVar2 = GetGraphIdLocked(mu);
  uVar1 = deadlock_graph_mu;
  uVar3 = deadlock_graph_mu & 2;
  LOCK();
  UNLOCK();
  bVar4 = 7 < deadlock_graph_mu;
  deadlock_graph_mu = uVar3;
  if (bVar4) {
    base_internal::SpinLock::SlowUnlock((SpinLock *)&deadlock_graph_mu,uVar1);
  }
  return (GraphId)GVar2.handle;
}

Assistant:

ABSL_LOCKS_EXCLUDED(deadlock_graph_mu) {
  deadlock_graph_mu.Lock();
  GraphId id = GetGraphIdLocked(mu);
  deadlock_graph_mu.Unlock();
  return id;
}